

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

PatternBlock * TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  PatternBlock *this;
  byte bVar4;
  int4 off;
  
  cVar1 = (char)startbit;
  off = 0;
  if (7 < startbit) {
    iVar2 = 0xf;
    if (startbit < 0xf) {
      iVar2 = startbit;
    }
    uVar3 = (startbit - iVar2) + 7;
    off = (uVar3 >> 3) + 1;
    startbit = (startbit - (uVar3 & 0xfffffff8)) + -8;
  }
  bVar4 = (cVar1 - (char)endbit) + 0x1f;
  this = (PatternBlock *)operator_new(0x38);
  PatternBlock::PatternBlock
            (this,off,(uint)(-1 << (bVar4 & 0x1f)) >> ((byte)startbit & 0x1f),
             (byteval << (bVar4 & 0x1f)) >> ((byte)startbit & 0x1f));
  return this;
}

Assistant:

PatternBlock *TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{				// Create a mask/value pattern within a single word
				// The field is given by the bitrange [startbit,endbit]
				// bit 0 is the MOST sig bit of the word
				// use the least sig bits of byteval to fill in
				// the field's value
  uintm mask;
  int4 offset = 0;
  int4 size = endbit-startbit+1;
  while(startbit >= 8) {
    offset += 1;
    startbit -= 8;
    endbit -= 8;
  }
  mask = (~((uintm)0)) << (sizeof(uintm)*8-size);
  byteval = (byteval << (sizeof(uintm)*8-size))& mask;
  mask >>= startbit;
  byteval >>= startbit;
  return new PatternBlock(offset,mask,byteval);
}